

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O2

void __thiscall libtorrent::utp_socket_impl::send_syn(utp_socket_impl *this)

{
  byte bVar1;
  utp_socket_manager *this_00;
  ulong_long_type uVar2;
  bool bVar3;
  undefined8 uVar4;
  uint16_t uVar5;
  long lVar6;
  error_code eVar7;
  undefined1 local_90 [24];
  error_code ec;
  undefined1 local_68 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_58;
  endpoint local_4c;
  
  lVar6 = random((libtorrent *)0xffff);
  uVar5 = (uint16_t)lVar6;
  this->m_seq_nr = uVar5;
  this->m_acked_seq_nr = uVar5 - 1;
  this->m_loss_seq_nr = uVar5 - 1;
  this->m_ack_nr = 0;
  this->m_fast_resend_seq_nr = uVar5;
  acquire_packet((utp_socket_impl *)local_90,(int)this);
  uVar4 = local_90._0_8_;
  *(undefined4 *)((long)&(((send_fun_t *)local_90._0_8_)->super__Function_base)._M_functor + 10) =
       0x140014;
  *(undefined2 *)((long)&(((send_fun_t *)local_90._0_8_)->super__Function_base)._M_functor + 0xe) =
       0x4100;
  *(undefined1 *)&(((send_fun_t *)local_90._0_8_)->super__Function_base)._M_manager = 0;
  big_endian_int<unsigned_short>::operator=
            ((big_endian_int<unsigned_short> *)
             ((long)&(((send_fun_t *)local_90._0_8_)->super__Function_base)._M_manager + 1),
             this->m_recv_id);
  big_endian_int<unsigned_int>::operator=
            ((big_endian_int<unsigned_int> *)
             ((long)&(((send_fun_t *)uVar4)->super__Function_base)._M_manager + 7),
             this->m_reply_micro);
  big_endian_int<unsigned_int>::operator=
            ((big_endian_int<unsigned_int> *)((long)&((send_fun_t *)uVar4)->_M_invoker + 3),0);
  big_endian_int<unsigned_short>::operator=
            ((big_endian_int<unsigned_short> *)((long)&((send_fun_t *)uVar4)->_M_invoker + 7),
             this->m_seq_nr);
  big_endian_int<unsigned_short>::operator=
            ((big_endian_int<unsigned_short> *)
             ((long)&(((incoming_utp_callback_t *)(uVar4 + 0x20))->super__Function_base)._M_functor
             + 1),0);
  lVar6 = std::chrono::_V2::system_clock::now();
  *(long *)&(((send_fun_t *)local_90._0_8_)->super__Function_base)._M_functor = lVar6;
  big_endian_int<unsigned_int>::operator=
            ((big_endian_int<unsigned_int> *)
             ((long)&(((send_fun_t *)uVar4)->super__Function_base)._M_manager + 3),
             (uint)(lVar6 / 1000));
  ec.val_ = 0;
  ec._4_4_ = ec._4_4_ & 0xffffff00;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  this_00 = this->m_sm;
  std::__weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            ((__weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2> *)
             (local_68 + 8),
             &(this->m_sock).
              super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>);
  boost::asio::ip::detail::endpoint::endpoint(&local_4c,&this->m_remote_address,this->m_port);
  utp_socket_manager::send_packet
            (this_00,(weak_ptr<libtorrent::utp_socket_interface> *)(local_68 + 8),
             (endpoint *)&local_4c,
             (((send_fun_t *)uVar4)->super__Function_base)._M_functor._M_pod_data + 0xf,0x14,&ec,
             (udp_send_flags_t)0x0);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_58);
  eVar7 = boost::asio::error::make_error_code(try_again);
  if (ec.val_ == eVar7.val_) {
    uVar2 = (eVar7.cat_)->id_;
    bVar3 = (ec.cat_)->id_ == uVar2;
    if (uVar2 == 0) {
      bVar3 = ec.cat_ == eVar7.cat_;
    }
    if (!bVar3) goto LAB_002d4ec7;
LAB_002d4efb:
    if ((*(ushort *)&this->field_0x21a >> 0xd & 1) == 0) {
      *(ushort *)&this->field_0x21a = *(ushort *)&this->field_0x21a | 0x2000;
      utp_socket_manager::subscribe_writable(this->m_sm,this);
    }
  }
  else {
LAB_002d4ec7:
    eVar7 = boost::asio::error::make_error_code(try_again);
    if (ec.val_ == eVar7.val_) {
      uVar2 = (eVar7.cat_)->id_;
      bVar3 = (ec.cat_)->id_ == uVar2;
      if (uVar2 == 0) {
        bVar3 = ec.cat_ == eVar7.cat_;
      }
      if (bVar3) goto LAB_002d4efb;
    }
    if (ec.failed_ == true) {
      local_90._16_8_ = local_90._0_8_;
      local_90._0_8_ = (utp_socket_manager *)0x0;
      release_packet(this,(packet_ptr *)(local_90 + 0x10));
      free((void *)local_90._16_8_);
      local_90._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->m_error).val_ = ec.val_;
      (this->m_error).failed_ = (bool)ec.failed_;
      *(int3 *)&(this->m_error).field_0x5 = ec._5_3_;
      (this->m_error).cat_ = ec.cat_;
      set_state(this,4);
      test_socket_state(this);
      goto LAB_002d4fef;
    }
  }
  if ((this->field_0x21b & 0x20) == 0) {
    bVar1 = (((send_fun_t *)local_90._0_8_)->super__Function_base)._M_functor._M_pod_data[0xe];
    (((send_fun_t *)local_90._0_8_)->super__Function_base)._M_functor._M_pod_data[0xe] =
         bVar1 & 0xc0 | bVar1 + 1 & 0x3f;
  }
  local_90._8_8_ = local_90._0_8_;
  local_90._0_8_ = (utp_socket_manager *)0x0;
  packet_buffer::insert
            ((packet_buffer *)local_68,(int)this + 0xc0,(packet_ptr *)(ulong)this->m_seq_nr);
  free((void *)local_68._0_8_);
  local_68._0_8_ =
       (_Head_base<0UL,_std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>_*,_false>)
       0x0;
  free((void *)local_90._8_8_);
  local_90._8_8_ = (element_type *)0x0;
  this->m_seq_nr = this->m_seq_nr + 1;
  set_state(this,1);
LAB_002d4fef:
  free((void *)local_90._0_8_);
  return;
}

Assistant:

void utp_socket_impl::send_syn()
{
	INVARIANT_CHECK;

	m_seq_nr = std::uint16_t(random(0xffff));
	m_acked_seq_nr = (m_seq_nr - 1) & ACK_MASK;
	m_loss_seq_nr = m_acked_seq_nr;
	m_ack_nr = 0;
	m_fast_resend_seq_nr = m_seq_nr;

	packet_ptr p = acquire_packet(sizeof(utp_header));
	p->size = sizeof(utp_header);
	p->header_size = sizeof(utp_header);
	p->num_transmissions = 0;
	p->mtu_probe = false;
#if TORRENT_USE_ASSERTS
	p->num_fast_resend = 0;
#endif
	p->need_resend = false;
	auto* h = reinterpret_cast<utp_header*>(p->buf);
	h->type_ver = (ST_SYN << 4) | 1;
	h->extension = utp_no_extension;
	// using recv_id here is intentional! This is an odd
	// thing in uTP. The syn packet is sent with the connection
	// ID that it expects to receive the syn ack on. All
	// subsequent connection IDs will be this plus one.
	h->connection_id = m_recv_id;
	h->timestamp_difference_microseconds = m_reply_micro;
	h->wnd_size = 0;
	h->seq_nr = m_seq_nr;
	h->ack_nr = 0;

	time_point const now = clock_type::now();
	p->send_time = now;
	h->timestamp_microseconds = std::uint32_t(
		total_microseconds(now.time_since_epoch()) & 0xffffffff);

#if TORRENT_UTP_LOG
	UTP_LOGV("%8p: send_syn seq_nr:%d id:%d target:%s\n"
		, static_cast<void*>(this), int(m_seq_nr), int(m_recv_id)
		, print_endpoint(udp::endpoint(m_remote_address, m_port)).c_str());
#endif

	error_code ec;
	m_sm.send_packet(m_sock, udp::endpoint(m_remote_address, m_port)
		, reinterpret_cast<char const*>(h) , sizeof(utp_header), ec);

	if (ec == error::would_block || ec == error::try_again)
	{
#if TORRENT_UTP_LOG
		UTP_LOGV("%8p: socket stalled\n", static_cast<void*>(this));
#endif
		if (!m_stalled)
		{
			m_stalled = true;
			m_sm.subscribe_writable(this);
		}
	}
	else if (ec)
	{
		release_packet(std::move(p));
		m_error = ec;
		set_state(UTP_STATE_ERROR_WAIT);
		test_socket_state();
		return;
	}

	if (!m_stalled)
		++p->num_transmissions;

	TORRENT_ASSERT(!m_outbuf.at(m_seq_nr));
	TORRENT_ASSERT(h->seq_nr == m_seq_nr);
	TORRENT_ASSERT(p->buf == reinterpret_cast<std::uint8_t*>(h));
	m_outbuf.insert(m_seq_nr, std::move(p));

	m_seq_nr = (m_seq_nr + 1) & ACK_MASK;

	TORRENT_ASSERT(!m_error);
	set_state(UTP_STATE_SYN_SENT);
#if TORRENT_UTP_LOG
	UTP_LOGV("%8p: state:%s\n", static_cast<void*>(this), socket_state_names[m_state]);
#endif
}